

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlIsID(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlAttributePtr pxVar3;
  xmlChar *pxVar4;
  xmlNs *pxVar5;
  xmlChar felem [50];
  
  if ((attr != (xmlAttrPtr)0x0) && (pxVar2 = attr->name, pxVar2 != (xmlChar *)0x0)) {
    if ((doc == (xmlDocPtr)0x0) || (doc->type != XML_HTML_DOCUMENT_NODE)) {
      pxVar5 = attr->ns;
      if ((((pxVar5 == (xmlNs *)0x0) || (pxVar5->prefix == (xmlChar *)0x0)) || (*pxVar2 != 'i')) ||
         ((pxVar2[1] != 'd' || (pxVar2[2] != '\0')))) {
        if (doc == (xmlDocPtr)0x0) {
          return 0;
        }
      }
      else {
        iVar1 = strcmp((char *)pxVar5->prefix,"xml");
        if (doc == (xmlDocPtr)0x0) {
          return (uint)(iVar1 == 0);
        }
        if (iVar1 == 0) {
          return (uint)(iVar1 == 0);
        }
      }
      if (doc->intSubset == (_xmlDtd *)0x0) {
        if (elem == (xmlNodePtr)0x0) {
          return 0;
        }
        if (doc->extSubset == (_xmlDtd *)0x0) {
          return 0;
        }
      }
      else if (elem == (xmlNodePtr)0x0) {
        return 0;
      }
      if (elem->type != XML_ELEMENT_NODE) {
        return 0;
      }
      pxVar2 = elem->name;
      if (pxVar2 == (xmlChar *)0x0) {
        return 0;
      }
      if ((elem->ns != (xmlNs *)0x0) && (pxVar4 = elem->ns->prefix, pxVar4 != (xmlChar *)0x0)) {
        pxVar2 = xmlBuildQName(pxVar2,pxVar4,felem,0x32);
        if (pxVar2 == (xmlChar *)0x0) {
          return -1;
        }
        pxVar5 = attr->ns;
      }
      if (pxVar5 == (xmlNs *)0x0) {
        pxVar4 = (xmlChar *)0x0;
      }
      else {
        pxVar4 = pxVar5->prefix;
      }
      pxVar3 = xmlGetDtdQAttrDesc(doc->intSubset,pxVar2,attr->name,pxVar4);
      if (pxVar3 == (xmlAttributePtr)0x0) {
        if (doc->extSubset == (xmlDtdPtr)0x0) {
          pxVar3 = (xmlAttributePtr)0x0;
        }
        else {
          pxVar3 = xmlGetDtdQAttrDesc(doc->extSubset,pxVar2,attr->name,pxVar4);
        }
      }
      if ((pxVar2 != felem) && (pxVar2 != elem->name)) {
        (*xmlFree)(pxVar2);
      }
      if ((pxVar3 != (xmlAttributePtr)0x0) && (pxVar3->atype == XML_ATTRIBUTE_ID)) {
        return 1;
      }
    }
    else {
      iVar1 = xmlStrEqual("id",pxVar2);
      if (iVar1 != 0) {
        return 1;
      }
      if ((((elem != (xmlNodePtr)0x0) && (elem->type == XML_ELEMENT_NODE)) &&
          (iVar1 = xmlStrEqual("name",attr->name), iVar1 != 0)) &&
         (iVar1 = xmlStrEqual(elem->name,"a"), iVar1 != 0)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int
xmlIsID(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if ((attr == NULL) || (attr->name == NULL))
        return(0);

    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        if (xmlStrEqual(BAD_CAST "id", attr->name))
            return(1);

        if ((elem == NULL) || (elem->type != XML_ELEMENT_NODE))
            return(0);

        if ((xmlStrEqual(BAD_CAST "name", attr->name)) &&
	    (xmlStrEqual(elem->name, BAD_CAST "a")))
	    return(1);
    } else {
	xmlAttributePtr attrDecl = NULL;
	xmlChar felem[50];
	xmlChar *fullelemname;
        const xmlChar *aprefix;

        if ((attr->ns != NULL) && (attr->ns->prefix != NULL) &&
            (!strcmp((char *) attr->name, "id")) &&
            (!strcmp((char *) attr->ns->prefix, "xml")))
            return(1);

        if ((doc == NULL) ||
            ((doc->intSubset == NULL) && (doc->extSubset == NULL)))
            return(0);

        if ((elem == NULL) ||
            (elem->type != XML_ELEMENT_NODE) ||
            (elem->name == NULL))
            return(0);

	fullelemname = (elem->ns != NULL && elem->ns->prefix != NULL) ?
	    xmlBuildQName(elem->name, elem->ns->prefix, felem, 50) :
	    (xmlChar *)elem->name;
        if (fullelemname == NULL)
            return(-1);

        aprefix = (attr->ns != NULL) ? attr->ns->prefix : NULL;

	if (fullelemname != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullelemname,
		                          attr->name, aprefix);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullelemname,
					      attr->name, aprefix);
	}

	if ((fullelemname != felem) && (fullelemname != elem->name))
	    xmlFree(fullelemname);

        if ((attrDecl != NULL) && (attrDecl->atype == XML_ATTRIBUTE_ID))
	    return(1);
    }

    return(0);
}